

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O0

void read_utf8(charset_spec_conflict *charset,long input_chr,charset_state *state,
              _func_void_void_ptr_long *emit,void *emitctx)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  int bytes;
  unsigned_long topstuff;
  unsigned_long charval;
  void *emitctx_local;
  _func_void_void_ptr_long *emit_local;
  charset_state *state_local;
  long input_chr_local;
  charset_spec_conflict *charset_local;
  
  if (input_chr < 0x80) {
    if (state->s0 != 0) {
      (*emit)(emitctx,0xffff);
      state->s0 = 0;
    }
    (*emit)(emitctx,input_chr);
  }
  else if ((input_chr == 0xfe) || (input_chr == 0xff)) {
    if (state->s0 != 0) {
      (*emit)(emitctx,0xffff);
      state->s0 = 0;
    }
    (*emit)(emitctx,0xffff);
  }
  else if ((input_chr < 0x80) || (0xbf < input_chr)) {
    if (state->s0 != 0) {
      (*emit)(emitctx,0xffff);
    }
    if ((input_chr < 0xc0) || (0xdf < input_chr)) {
      if ((input_chr < 0xe0) || (0xef < input_chr)) {
        if ((input_chr < 0xf0) || (0xf7 < input_chr)) {
          if ((input_chr < 0xf8) || (0xfb < input_chr)) {
            if ((0xfb < input_chr) && (input_chr < 0xfe)) {
              state->s0 = input_chr & 1U | 0xc4000000;
            }
          }
          else {
            state->s0 = input_chr & 3U | 0xa4000000;
          }
        }
        else {
          state->s0 = input_chr & 7U | 0x84000000;
        }
      }
      else {
        state->s0 = input_chr & 0xfU | 0x64000000;
      }
    }
    else {
      state->s0 = input_chr & 0x1fU | 0x44000000;
    }
  }
  else if (state->s0 == 0) {
    (*emit)(emitctx,0xffff);
  }
  else {
    uVar2 = (state->s0 & 0x3ffffff) << 6 | input_chr & 0x3fU;
    uVar3 = (state->s0 & 0xfc000000) + 0x4000000;
    if (((uVar3 * 8 ^ uVar3) & 0xe0000000) == 0) {
      uVar1 = (uint)(uVar3 >> 0x1d);
      state->s0 = 0;
      if ((uVar2 < 0xd800) || (0xdfff < uVar2)) {
        if ((uVar2 == 0xfffe) || (uVar2 == 0xffff)) {
          (*emit)(emitctx,0xffff);
        }
        else if ((((uVar2 < 0x80) || ((uVar2 < 0x800 && (2 < uVar1)))) ||
                 ((uVar2 < 0x10000 && (3 < uVar1)))) ||
                (((uVar2 < 0x200000 && (4 < uVar1)) || ((uVar2 < 0x4000000 && (5 < uVar1)))))) {
          (*emit)(emitctx,0xffff);
        }
        else {
          (*emit)(emitctx,uVar2);
        }
      }
      else {
        (*emit)(emitctx,0xffff);
      }
    }
    else {
      state->s0 = uVar3 | uVar2;
    }
  }
  return;
}

Assistant:

static void read_utf8(charset_spec const *charset, long int input_chr,
                      charset_state *state,
                      void (*emit)(void *ctx, long int output), void *emitctx)
{
    UNUSEDARG(charset);

    /*
     * For reading UTF-8, the `state' word contains:
     *
     *  - in bits 29-31, the number of bytes expected to be in the
     *    current multibyte character (which we can tell instantly
     *    from the first byte, of course).
     *
     *  - in bits 26-28, the number of bytes _seen so far_ in the
     *    current multibyte character.
     *
     *  - in the remainder of the word, the current value of the
     *    character, which is shifted upwards by 6 bits to
     *    accommodate each new byte.
     *
     * As required, the state is zero when we are not in the middle
     * of a multibyte character at all.
     *
     * For example, when reading E9 8D 8B, starting at state=0:
     *
     *  - after E9, the state is 0x64000009
     *  - after 8D, the state is 0x6800024d
     *  - after 8B, the state conceptually becomes 0x6c00934b, at
     *    which point we notice we've got as many characters as we
     *    were expecting, output U+934B, and reset the state to
     *    zero.
     *
     * Note that the maximum number of bits we might need to store
     * in the character value field is 25 (U+7FFFFFFF contains 31
     * bits, but we will never actually store its full value
     * because when we receive the last 6 bits in the final
     * continuation byte we will output it and revert the state to
     * zero). Hence the character value field never collides with
     * the byte counts.
     */

    if (input_chr < 0x80) {
        /*
         * Single-byte character. If the state is nonzero before
         * coming here, output an error for an incomplete sequence.
         * Then output the character.
         */
        if (state->s0 != 0) {
            emit(emitctx, ERROR);
            state->s0 = 0;
        }
        emit(emitctx, input_chr);
    } else if (input_chr == 0xFE || input_chr == 0xFF) {
        /*
         * FE and FF bytes should _never_ occur in UTF-8. They are
         * automatic errors; if the state was nonzero to start
         * with, output a further error for an incomplete sequence.
         */
        if (state->s0 != 0) {
            emit(emitctx, ERROR);
            state->s0 = 0;
        }
        emit(emitctx, ERROR);
    } else if (input_chr >= 0x80 && input_chr < 0xC0) {
        /*
         * Continuation byte. Output an error for an unexpected
         * continuation byte, if the state is zero.
         */
        if (state->s0 == 0) {
            emit(emitctx, ERROR);
        } else {
            unsigned long charval;
            unsigned long topstuff;
            int bytes;

            /*
             * Otherwise, accumulate more of the character value.
             */
            charval = state->s0 & 0x03ffffffL;
            charval = (charval << 6) | (input_chr & 0x3F);

            /*
             * Check the byte counts; if we have not reached the
             * end of the character, update the state and return.
             */
            topstuff = state->s0 & 0xfc000000L;
            topstuff += 0x04000000L;   /* add one to the byte count */
            if (((topstuff << 3) ^ topstuff) & 0xe0000000L) {
                state->s0 = topstuff | charval;
                return;
            }

            /*
             * Now we know we've reached the end of the character.
             * `charval' is the Unicode value. We should check for
             * various invalid things, and then either output
             * charval or an error. In all cases we reset the state
             * to zero.
             */
            bytes = topstuff >> 29;
            state->s0 = 0;

            if (charval >= 0xD800 && charval < 0xE000) {
                /*
                 * Surrogates (0xD800-0xDFFF) may never be encoded
                 * in UTF-8. A surrogate pair in Unicode should
                 * have been encoded as a single UTF-8 character
                 * occupying more than three bytes.
                 */
                emit(emitctx, ERROR);
            } else if (charval == 0xFFFE || charval == 0xFFFF) {
                /*
                 * U+FFFE and U+FFFF are invalid Unicode characters
                 * and may never be encoded in UTF-8. (This is one
                 * reason why U+FFFF is our way of signalling an
                 * error to our `emit' function :-)
                 */
                emit(emitctx, ERROR);
            } else if ((charval <= 0x7FL /* && bytes > 1 */) ||
                       (charval <= 0x7FFL && bytes > 2) ||
                       (charval <= 0xFFFFL && bytes > 3) ||
                       (charval <= 0x1FFFFFL && bytes > 4) ||
                       (charval <= 0x3FFFFFFL && bytes > 5)) {
                /*
                 * Overlong sequences are not to be tolerated,
                 * under any circumstances.
                 */
                emit(emitctx, ERROR);
            } else {
                /*
                 * Oh, all right. We'll let this one off.
                 */
                emit(emitctx, charval);
            }
        }

    } else {
        /*
         * Lead byte. First output an error for an incomplete
         * sequence, if the state is nonzero.
         */
        if (state->s0 != 0)
            emit(emitctx, ERROR);

        /*
         * Now deal with the lead byte: work out the number of
         * bytes we expect to see in this character, and extract
         * the initial bits of it too.
         */
        if (input_chr >= 0xC0 && input_chr < 0xE0) {
            state->s0 = 0x44000000L | (input_chr & 0x1F);
        } else if (input_chr >= 0xE0 && input_chr < 0xF0) {
            state->s0 = 0x64000000L | (input_chr & 0x0F);
        } else if (input_chr >= 0xF0 && input_chr < 0xF8) {
            state->s0 = 0x84000000L | (input_chr & 0x07);
        } else if (input_chr >= 0xF8 && input_chr < 0xFC) {
            state->s0 = 0xa4000000L | (input_chr & 0x03);
        } else if (input_chr >= 0xFC && input_chr < 0xFE) {
            state->s0 = 0xc4000000L | (input_chr & 0x01);
        }
    }
}